

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O3

void __thiscall
QExplicitlySharedDataPointer<QStorageInfoPrivate>::detach_helper
          (QExplicitlySharedDataPointer<QStorageInfoPrivate> *this)

{
  QStorageInfoPrivate *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  qint64 qVar4;
  qint64 qVar5;
  undefined8 uVar6;
  QStorageInfoPrivate *pQVar7;
  
  pQVar7 = (QStorageInfoPrivate *)operator_new(0xa0);
  pQVar1 = (this->d).ptr;
  (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  pDVar2 = (pQVar1->rootPath).d.d;
  (pQVar7->rootPath).d.d = pDVar2;
  (pQVar7->rootPath).d.ptr = (pQVar1->rootPath).d.ptr;
  (pQVar7->rootPath).d.size = (pQVar1->rootPath).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1
         );
    UNLOCK();
  }
  pDVar3 = (pQVar1->device).d.d;
  (pQVar7->device).d.d = pDVar3;
  (pQVar7->device).d.ptr = (pQVar1->device).d.ptr;
  (pQVar7->device).d.size = (pQVar1->device).d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1
         );
    UNLOCK();
  }
  pDVar3 = (pQVar1->subvolume).d.d;
  (pQVar7->subvolume).d.d = pDVar3;
  (pQVar7->subvolume).d.ptr = (pQVar1->subvolume).d.ptr;
  (pQVar7->subvolume).d.size = (pQVar1->subvolume).d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1
         );
    UNLOCK();
  }
  pDVar3 = (pQVar1->fileSystemType).d.d;
  (pQVar7->fileSystemType).d.d = pDVar3;
  (pQVar7->fileSystemType).d.ptr = (pQVar1->fileSystemType).d.ptr;
  (pQVar7->fileSystemType).d.size = (pQVar1->fileSystemType).d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1
         );
    UNLOCK();
  }
  pDVar2 = (pQVar1->name).d.d;
  (pQVar7->name).d.d = pDVar2;
  (pQVar7->name).d.ptr = (pQVar1->name).d.ptr;
  (pQVar7->name).d.size = (pQVar1->name).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1
         );
    UNLOCK();
  }
  qVar4 = pQVar1->bytesTotal;
  qVar5 = pQVar1->bytesFree;
  uVar6 = *(undefined8 *)((long)&pQVar1->bytesAvailable + 7);
  *(undefined8 *)((long)&pQVar7->bytesFree + 7) = *(undefined8 *)((long)&pQVar1->bytesFree + 7);
  *(undefined8 *)((long)&pQVar7->bytesAvailable + 7) = uVar6;
  pQVar7->bytesTotal = qVar4;
  pQVar7->bytesFree = qVar5;
  LOCK();
  (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type_conflict)
        (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type_conflict)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type_conflict)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> == 0) {
    pQVar1 = (this->d).ptr;
    if (pQVar1 != (QStorageInfoPrivate *)0x0) {
      QStorageInfoPrivate::~QStorageInfoPrivate(pQVar1);
    }
    operator_delete(pQVar1,0xa0);
  }
  (this->d).ptr = pQVar7;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QExplicitlySharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d->ref.deref())
        delete d.get();
    d.reset(x);
}